

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O0

int __thiscall cmCTest::RunCMakeAndTest(cmCTest *this,string *output)

{
  int iVar1;
  pointer pPVar2;
  cmCTestBuildAndTestHandler *this_00;
  char *pcVar3;
  ostream *this_01;
  void *this_02;
  string local_1d0 [48];
  ostringstream local_1a0 [8];
  ostringstream cmCTestLog_msg;
  int retv;
  cmCTestBuildAndTestHandler *handler;
  string *output_local;
  cmCTest *this_local;
  
  pPVar2 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::operator->
                     (&this->Impl);
  pPVar2->Verbose = true;
  this_00 = GetBuildAndTestHandler(this);
  iVar1 = (*(this_00->super_cmCTestGenericHandler)._vptr_cmCTestGenericHandler[1])();
  pcVar3 = cmCTestBuildAndTestHandler::GetOutput(this_00);
  std::__cxx11::string::operator=((string *)output,pcVar3);
  cmDynamicLoader::FlushCache();
  if (iVar1 != 0) {
    std::__cxx11::ostringstream::ostringstream(local_1a0);
    this_01 = std::operator<<((ostream *)local_1a0,"build and test failing returning: ");
    this_02 = (void *)std::ostream::operator<<(this_01,iVar1);
    std::ostream::operator<<(this_02,std::endl<char,std::char_traits<char>>);
    std::__cxx11::ostringstream::str();
    pcVar3 = (char *)std::__cxx11::string::c_str();
    Log(this,0,
        "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCTest.cxx"
        ,0xb79,pcVar3,false);
    std::__cxx11::string::~string(local_1d0);
    std::__cxx11::ostringstream::~ostringstream(local_1a0);
  }
  return iVar1;
}

Assistant:

int cmCTest::RunCMakeAndTest(std::string* output)
{
  this->Impl->Verbose = true;
  cmCTestBuildAndTestHandler* handler = this->GetBuildAndTestHandler();
  int retv = handler->ProcessHandler();
  *output = handler->GetOutput();
#ifndef CMAKE_BOOTSTRAP
  cmDynamicLoader::FlushCache();
#endif
  if (retv != 0) {
    cmCTestLog(this, DEBUG,
               "build and test failing returning: " << retv << std::endl);
  }
  return retv;
}